

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O2

response_ptr __thiscall
lsp::LanguageService::request_textDocument_hover(LanguageService *this,Id *id,Parameter *params)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  response_ptr rVar1;
  json result;
  TextDocumentPositionParams p;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  bStack_c8;
  Hover local_b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  TextDocumentPositionParams local_78 [2];
  
  (*(params->super_NullableEntity).super_Entity._vptr_Entity[3])(&local_b8,params);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get<lsp::types::TextDocumentPositionParams,_lsp::types::TextDocumentPositionParams,_0>
            (local_78,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&local_b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&bStack_c8,(nullptr_t)0x0);
  XmlParser::getHover(&local_b8,
                      xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,local_78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<const_lsp::types::Hover,_lsp::types::Hover,_0>(&local_88,&local_b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(&bStack_c8,&local_88);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_88);
  std::__cxx11::string::~string((string *)&local_b8);
  std::
  make_shared<jsonrpcpp::Response,jsonrpcpp::Id_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
            ((Id *)this,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)id);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&bStack_c8);
  std::__cxx11::string::~string((string *)local_78);
  rVar1.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  rVar1.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (response_ptr)rVar1.super___shared_ptr<jsonrpcpp::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

jsonrpcpp::response_ptr lsp::LanguageService::request_textDocument_hover(const jsonrpcpp::Id &id, const jsonrpcpp::Parameter &params)
{
    lsp::types::TextDocumentPositionParams p = params.to_json().get<lsp::types::TextDocumentPositionParams>();
    json result;
    try
    {
        result = xmlParser_->getHover(p);
        return std::make_shared<jsonrpcpp::Response>(id, result);     
    }
    catch(lsp::elementNotFoundException &e)
    {
        result = nullptr;
    }
    catch(lsp::multipleDefinitionException &e)
    {
        toClient_notification_telemetry_event_error(lsp::types::arxmlError::multipleDefinitions);
        result = nullptr;
    }
    catch(lsp::badUriException &e)
    {
        result = nullptr;
    }
    return std::make_shared<jsonrpcpp::Response>(id, result);
}